

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_2_suite::test_clear(void)

{
  undefined8 local_80;
  value_type local_78;
  undefined4 local_6c;
  size_type local_68;
  undefined4 local_5c;
  size_type local_58;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  moment<double,_2> filter;
  
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38,1.0);
  local_48[0] = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::size
                          ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_4c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x8f,"void mean_double_2_suite::test_clear()",local_48,&local_4c);
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::clear
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_58 = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::size
                       ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x91,"void mean_double_2_suite::test_clear()",&local_58,&local_5c);
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38,2.0);
  local_68 = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::size
                       ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x93,"void mean_double_2_suite::test_clear()",&local_68,&local_6c);
  local_78 = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_80 = 0x4000000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x94,"void mean_double_2_suite::test_clear()",&local_78,&local_80);
  return;
}

Assistant:

void test_clear()
{
    window::moment<double, 2> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    filter.clear();
    TRIAL_TEST_EQ(filter.size(), 0);
    filter.push(2.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 2.0);
}